

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O0

bool __thiscall
higan::MultiplexEpoll::UpdateChannelEvent
          (MultiplexEpoll *this,Channel *channel,int event,int option)

{
  int __epfd;
  undefined4 __op;
  int __fd;
  LogLevel LVar1;
  uint uVar2;
  char *local_380;
  char *local_378;
  Fmt local_350;
  Logger local_250;
  int local_38;
  undefined1 local_34 [4];
  int result;
  epoll_event ev;
  int option_local;
  int event_local;
  Channel *channel_local;
  MultiplexEpoll *this_local;
  
  if (channel == (Channel *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ev.data.fd = option;
    ev.data.u64._4_4_ = event;
    memset(local_34,0,0xc);
    __op = ev.data.fd;
    local_34 = (undefined1  [4])ev.data.u64._4_4_;
    __epfd = this->epollfd_;
    _result = channel;
    __fd = Channel::GetFd(channel);
    local_38 = epoll_ctl(__epfd,__op,__fd,(epoll_event *)local_34);
    if ((local_38 == -1) && (LVar1 = Logger::GetLogLevel(), (int)LVar1 < 4)) {
      Logger::Logger(&local_250,ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/multiplexing/MultiplexEpoll.cpp"
                     ,99,"UpdateChannelEvent");
      if (ev.data.fd == 1) {
        local_378 = "ADD";
      }
      else {
        if (ev.data.fd == 2) {
          local_380 = "DEL";
        }
        else {
          local_380 = "UNKNOWN";
          if (ev.data.fd == 3) {
            local_380 = "MOD";
          }
        }
        local_378 = local_380;
      }
      uVar2 = Channel::GetFd(channel);
      Fmt::Fmt(&local_350,"EPOLL_CTL_%s error, fd: %d",local_378,(ulong)uVar2);
      Logger::operator<<(&local_250,&local_350);
      Logger::~Logger(&local_250);
    }
    this_local._7_1_ = local_38 != 0;
  }
  return this_local._7_1_;
}

Assistant:

bool MultiplexEpoll::UpdateChannelEvent(Channel* channel, int event, int option) const
{
	if (channel == nullptr)
	{
		return false;
	}
	struct epoll_event ev{};
	ev.events = event;

	ev.data.ptr = static_cast<void*>(channel);
	ev.events = event;

	int result = epoll_ctl(epollfd_, option, channel->GetFd(), &ev);

	if (result == -1)
	{
		LOG_ERROR << higan::Fmt("EPOLL_CTL_%s error, fd: %d",
					option == EPOLL_CTL_ADD ? "ADD" :
					option == EPOLL_CTL_DEL ? "DEL" :
					option == EPOLL_CTL_MOD ? "MOD" : "UNKNOWN",
					channel->GetFd());
	}

	return result;
}